

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::cxx::anon_unknown_0::DotsToColons
                   (string *__return_storage_ptr__,string *name)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,".",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"::",&local_52);
  StringReplace(__return_storage_ptr__,name,&local_30,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string DotsToColons(const string& name) {
  return StringReplace(name, ".", "::", true);
}